

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basestat.cpp
# Opt level: O0

double MetaSim::BaseStat::t_student(int alfa,int dol)

{
  int dol_local;
  int alfa_local;
  double local_8;
  
  if ((dol < 1) || (0x1e < dol)) {
    local_8 = -1.0;
  }
  else if (alfa == 0x5a) {
    local_8 = *(double *)(t1_table + (long)(dol + -1) * 0x10);
  }
  else if (alfa == 0x5f) {
    local_8 = *(double *)(t1_table + (long)(dol + -1) * 0x10 + 8);
  }
  else {
    local_8 = -1.0;
  }
  return local_8;
}

Assistant:

double BaseStat::t_student(int alfa, int dol)
    {
        if (dol<1 || dol>30)
            return -1;
        switch (alfa) {
        case 90:
            return t1_table[dol-1][0];
            break;
        case 95:
            return t1_table[dol-1][1];
            break;
        default:
            return -1;
        }
    }